

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_common.cpp
# Opt level: O0

string * pstore::broker::gc_watch_thread::vacuumd_path_abi_cxx11_(void)

{
  string *in_RDI;
  allocator local_81;
  string local_80;
  string local_50;
  string local_30;
  
  process_file_name_abi_cxx11_();
  pstore::path::dir_name(&local_30,&local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"pstore-vacuumd",&local_81);
  pstore::path::join(in_RDI,&local_30,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return in_RDI;
}

Assistant:

std::string gc_watch_thread::vacuumd_path () {
            using path::dir_name;
            using path::join;
            return join (dir_name (process_file_name ()), vacuumd_name);
        }